

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_view_unittest.cpp
# Opt level: O0

void __thiscall array_view_const_view_Test::TestBody(array_view_const_view_Test *this)

{
  bool bVar1;
  pointer __first;
  pointer __last;
  size_type *psVar2;
  reference pvVar3;
  const_reference pvVar4;
  char *pcVar5;
  Range RVar6;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_2;
  size_type i_2;
  iterator __end1_2;
  iterator __begin1_2;
  Range *__range1_2;
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_158;
  undefined1 local_140 [8];
  const_view v_const_2;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  size_type i_1;
  iterator __end1_1;
  iterator __begin1_1;
  Range *__range1_1;
  const_view v_const_1;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  size_type i;
  iterator __end1;
  iterator __begin1;
  Range *__range1;
  const_view v_const;
  view v_non_const;
  undefined1 auStack_30 [8];
  vector v;
  array_view_const_view_Test *this_local;
  
  v._24_8_ = this;
  memory::
  Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>::
  Array<int,void>((Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                   *)auStack_30,10);
  __first = memory::
            ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
            ::begin((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                     *)auStack_30);
  __last = memory::
           ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
           ::end((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                  *)auStack_30);
  std::iota<int*,int>(__first,__last,0);
  v_const.size_ = (size_type)auStack_30;
  memory::
  ConstArrayViewImpl<memory::ConstArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
  ::
  ConstArrayViewImpl<memory::Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>&,void>
            ((ConstArrayViewImpl<memory::ConstArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
              *)&__range1,
             (Array<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
              *)auStack_30);
  RVar6 = memory::
          ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
          ::range((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                   *)auStack_30);
  __begin1.index_ = RVar6.left_;
  __end1 = memory::Range::begin((Range *)&__begin1);
  i = (size_type)memory::Range::end((Range *)&__begin1);
  while (bVar1 = memory::Range::iterator::operator!=(&__end1,(iterator *)&i), bVar1) {
    psVar2 = memory::Range::iterator::operator*(&__end1);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*psVar2;
    pvVar3 = memory::
             ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[]((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           *)auStack_30,(size_type)gtest_ar.message_.ptr_);
    pvVar4 = memory::
             ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[]((ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           *)&__range1,(size_type)gtest_ar.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_b0,"v[i]","v_const[i]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&v_const_1.size_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x15,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&v_const_1.size_,&local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_const_1.size_);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    memory::Range::iterator::operator++(&__end1);
  }
  memory::
  ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ConstArrayViewImpl
            ((ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
              *)&__range1);
  memory::
  ConstArrayViewImpl<memory::ConstArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
  ::
  ConstArrayViewImpl<memory::ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>&,void>
            ((ConstArrayViewImpl<memory::ConstArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
              *)&__range1_1,
             (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
              *)&v_const.size_);
  RVar6 = memory::
          ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
          ::range((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                   *)auStack_30);
  __begin1_1.index_ = RVar6.left_;
  __end1_1 = memory::Range::begin((Range *)&__begin1_1);
  i_1 = (size_type)memory::Range::end((Range *)&__begin1_1);
  while (bVar1 = memory::Range::iterator::operator!=(&__end1_1,(iterator *)&i_1), bVar1) {
    psVar2 = memory::Range::iterator::operator*(&__end1_1);
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*psVar2;
    pvVar3 = memory::
             ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[]((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           *)auStack_30,(size_type)gtest_ar_1.message_.ptr_);
    pvVar4 = memory::
             ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[]((ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           *)&__range1_1,(size_type)gtest_ar_1.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_118,"v[i]","v_const[i]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&v_const_2.size_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x1b,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&v_const_2.size_,&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_const_2.size_);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    memory::Range::iterator::operator++(&__end1_1);
  }
  memory::
  ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ConstArrayViewImpl
            ((ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
              *)&__range1_1);
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_158,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)auStack_30);
  memory::
  ConstArrayViewImpl<memory::ConstArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
  ::
  ConstArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,void>
            ((ConstArrayViewImpl<memory::ConstArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
              *)local_140,&local_158);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_158);
  RVar6 = memory::
          ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
          ::range((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                   *)auStack_30);
  __begin1_2.index_ = RVar6.left_;
  __end1_2 = memory::Range::begin((Range *)&__begin1_2);
  i_2 = (size_type)memory::Range::end((Range *)&__begin1_2);
  while (bVar1 = memory::Range::iterator::operator!=(&__end1_2,(iterator *)&i_2), bVar1) {
    psVar2 = memory::Range::iterator::operator*(&__end1_2);
    gtest_ar_2.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*psVar2;
    pvVar3 = memory::
             ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[]((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           *)auStack_30,(size_type)gtest_ar_2.message_.ptr_);
    pvVar4 = memory::
             ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[]((ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           *)local_140,(size_type)gtest_ar_2.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_1a0,"v[i]","v_const[i]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1a8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x21,pcVar5);
      testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      testing::Message::~Message(&local_1a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    memory::Range::iterator::operator++(&__end1_2);
  }
  memory::
  ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ConstArrayViewImpl
            ((ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
              *)local_140);
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayViewImpl((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                    *)&v_const.size_);
  memory::
  Array<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array((Array<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
            *)auStack_30);
  return;
}

Assistant:

TEST(array_view, const_view) {
    using vector = memory::HostVector<int>;
    using view   = vector::view_type;
    using const_view  = vector::const_view_type;

    vector v(10);
    std::iota(v.begin(), v.end(), 0);

    view v_non_const = v;

    {
        const_view v_const(v);
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
    {
        const_view v_const(v_non_const);
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
    {
        const_view v_const(v(memory::all));
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
}